

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcePosition.c
# Opt level: O0

void sysbvm_sourcePosition_dump(sysbvm_context_t *context,sysbvm_tuple_t sourcePosition)

{
  sysbvm_tuple_t sVar1;
  _Bool _Var2;
  size_t sVar3;
  sysbvm_sourceCode_t *sourceCode;
  uint32_t endColumn;
  uint32_t endLine;
  uint32_t startColumn;
  uint32_t startLine;
  sysbvm_sourcePosition_t *sourcePositionObject;
  sysbvm_tuple_t sourcePosition_local;
  sysbvm_context_t *context_local;
  
  sourcePositionObject = (sysbvm_sourcePosition_t *)sourcePosition;
  sourcePosition_local = (sysbvm_tuple_t)context;
  _Var2 = sysbvm_tuple_isNonNullPointer(sourcePosition);
  if (_Var2) {
    _startColumn = sourcePositionObject;
    endLine = 0;
    endColumn = 0;
    sourceCode._4_4_ = 0;
    sourceCode._0_4_ = 0;
    sysbvm_sourceCode_computeLineAndColumnForIndex
              ((sysbvm_context_t *)sourcePosition_local,sourcePositionObject->sourceCode,
               sourcePositionObject->startIndex,&endLine,&endColumn);
    sysbvm_sourceCode_computeLineAndColumnForIndex
              ((sysbvm_context_t *)sourcePosition_local,_startColumn->sourceCode,
               _startColumn->endIndex,(uint32_t *)((long)&sourceCode + 4),(uint32_t *)&sourceCode);
    _Var2 = sysbvm_tuple_isNonNullPointer(_startColumn->sourceCode);
    if (_Var2) {
      sVar1 = _startColumn->sourceCode;
      sVar3 = sysbvm_tuple_getSizeInBytes(*(sysbvm_tuple_t *)(sVar1 + 0x20));
      printf("%.*s:%d.%d-%d.%d\n",sVar3 & 0xffffffff,*(long *)(sVar1 + 0x20) + 0x10,(ulong)endLine,
             (ulong)endColumn,(ulong)sourceCode._4_4_,(uint)sourceCode);
    }
    else {
      printf("unknown:%d.%d-%d.%d\n",(ulong)endLine,(ulong)endColumn,(ulong)sourceCode._4_4_,
             (ulong)(uint)sourceCode);
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_sourcePosition_dump(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition)
{
    if(!sysbvm_tuple_isNonNullPointer(sourcePosition)) return;

    sysbvm_sourcePosition_t *sourcePositionObject = (sysbvm_sourcePosition_t*)sourcePosition;
    uint32_t startLine = 0;
    uint32_t startColumn = 0;
    uint32_t endLine = 0;
    uint32_t endColumn = 0;
    sysbvm_sourceCode_computeLineAndColumnForIndex(context, sourcePositionObject->sourceCode, sourcePositionObject->startIndex, &startLine, &startColumn);
    sysbvm_sourceCode_computeLineAndColumnForIndex(context, sourcePositionObject->sourceCode, sourcePositionObject->endIndex, &endLine, &endColumn);
    
    if(sysbvm_tuple_isNonNullPointer(sourcePositionObject->sourceCode))
    {
        sysbvm_sourceCode_t *sourceCode = (sysbvm_sourceCode_t*)sourcePositionObject->sourceCode;
        printf(SYSBVM_STRING_PRINTF_FORMAT ":%d.%d-%d.%d\n", SYSBVM_STRING_PRINTF_ARG(sourceCode->name),
            startLine, startColumn, endLine, endColumn);
    }
    else
    {
        printf("unknown:%d.%d-%d.%d\n", startLine, startColumn, endLine, endColumn);
    }
}